

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IPipelineResourceSignature>::Set
          (NamedResourceCache<Diligent::IPipelineResourceSignature> *this,ResourceType Type,
          char *Name,IPipelineResourceSignature *pResource)

{
  Char *pCVar1;
  NamedResourceKey local_a0;
  undefined1 local_88 [8];
  unique_lock<std::mutex> Lock;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  IPipelineResourceSignature *pResource_local;
  char *Name_local;
  ResourceType Type_local;
  NamedResourceCache<Diligent::IPipelineResourceSignature> *this_local;
  
  msg.field_2._8_8_ = pResource;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])pResource);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    pResource = (IPipelineResourceSignature *)0xac;
    DebugAssertionFailed
              (pCVar1,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xac);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[26],char[21]>
              ((string *)&Lock._M_owns,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pResource != nullptr",(char (*) [21])pResource);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)&Lock._M_owns);
  }
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_88,&this->m_Mtx);
  DeviceObjectArchive::NamedResourceKey::NamedResourceKey(&local_a0,Type,Name,true);
  std::
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>>
  ::emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::IPipelineResourceSignature*&>
            ((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>>
              *)&this->m_Map,&local_a0,(IPipelineResourceSignature **)((long)&msg.field_2 + 8));
  DeviceObjectArchive::NamedResourceKey::~NamedResourceKey(&local_a0);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  return;
}

Assistant:

void DearchiverBase::NamedResourceCache<ResType>::Set(ResourceType Type, const char* Name, ResType* pResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(pResource != nullptr);

    std::unique_lock<std::mutex> Lock{m_Mtx};
    m_Map.emplace(NamedResourceKey{Type, Name, /*CopyName = */ true}, pResource);
}